

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O3

int cuddZddSymmSiftingAux(DdManager *table,int x,int x_low,int x_high)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdSubtable *pDVar7;
  DdHalfWord *pDVar8;
  uint uVar9;
  ulong uVar10;
  uint initial_size;
  DdHalfWord x_00;
  uint uVar11;
  uint uVar12;
  long lVar13;
  DdNode *pDVar14;
  bool bVar15;
  
  initial_size = table->keysZ;
  if (x_low < x) {
    uVar12 = x;
    do {
      iVar2 = uVar12 - 1;
      iVar1 = cuddZddSymmCheck(table,iVar2,uVar12);
      if (iVar1 == 0) break;
      pDVar7 = table->subtableZ;
      uVar11 = pDVar7[iVar2].next;
      pDVar7[iVar2].next = uVar12;
      pDVar7[x].next = uVar11;
      uVar12 = uVar11;
    } while (x_low < (int)uVar11);
  }
  uVar12 = x;
  if (x < x_high) {
    do {
      uVar11 = uVar12 + 1;
      iVar2 = cuddZddSymmCheck(table,uVar12,uVar11);
      if (iVar2 == 0) break;
      pDVar7 = table->subtableZ;
      uVar9 = uVar11;
      do {
        uVar3 = uVar9;
        uVar9 = pDVar7[(int)uVar3].next;
      } while (uVar3 < pDVar7[(int)uVar3].next);
      pDVar7[(int)uVar3].next = pDVar7[(int)uVar12].next;
      pDVar7[(int)uVar12].next = uVar11;
      uVar12 = uVar3;
    } while ((int)uVar3 < x_high);
  }
  if (x == x_low) {
    uVar12 = x;
    do {
      uVar11 = uVar12;
      uVar12 = table->subtableZ[(int)uVar11].next;
    } while (uVar11 < uVar12);
    pDVar4 = (DdNode *)cuddZddSymmSifting_down(table,uVar11,x_high,initial_size);
    if (pDVar4 == (DdNode *)0x0) {
      pDVar7 = table->subtableZ;
      uVar10 = (ulong)pDVar7[(int)uVar11].next;
LAB_00928c41:
      iVar2 = (int)uVar10;
      do {
        uVar9 = (uint)uVar10;
        uVar10 = (ulong)pDVar7[(int)uVar9].next;
      } while (uVar9 < pDVar7[(int)uVar9].next);
      if (uVar11 - uVar12 != uVar9 - iVar2) {
        initial_size = table->keysZ;
LAB_00928c7c:
        pDVar6 = (DdNode *)cuddZddSymmSifting_up(table,iVar2,x,initial_size);
        pDVar5 = pDVar6;
LAB_00928e74:
        iVar2 = cuddZddSymmSiftingBackward(table,(Move *)pDVar6,initial_size);
        goto LAB_00928e79;
      }
    }
    else {
      if (pDVar4 == (DdNode *)0x1) {
        return 0;
      }
      pDVar7 = table->subtableZ;
      uVar10 = (ulong)pDVar4->ref;
      if (pDVar7[uVar10].next != pDVar4->ref) goto LAB_00928c41;
    }
    iVar2 = cuddZddSymmSiftingBackward(table,(Move *)pDVar4,initial_size);
    pDVar5 = (DdNode *)0x0;
LAB_00928e79:
    if (iVar2 != 0) {
      if (pDVar4 != (DdNode *)0x0) {
        pDVar6 = table->nextFree;
        do {
          pDVar14 = pDVar4;
          pDVar4 = (pDVar14->type).kids.T;
          pDVar14->ref = 0;
          pDVar14->next = pDVar6;
          pDVar6 = pDVar14;
        } while (pDVar4 != (DdNode *)0x0);
        table->nextFree = pDVar14;
      }
      iVar2 = 1;
      if (pDVar5 == (DdNode *)0x0) {
        return 1;
      }
      pDVar4 = table->nextFree;
      do {
        pDVar6 = pDVar5;
        pDVar5 = (pDVar6->type).kids.T;
        pDVar6->ref = 0;
        pDVar6->next = pDVar4;
        pDVar4 = pDVar6;
      } while (pDVar5 != (DdNode *)0x0);
      goto LAB_00928f32;
    }
LAB_00928edb:
    if ((DdNode *)0x1 < pDVar4) {
      pDVar6 = table->nextFree;
      do {
        pDVar14 = pDVar4;
        pDVar4 = (pDVar14->type).kids.T;
        pDVar14->ref = 0;
        pDVar14->next = pDVar6;
        pDVar6 = pDVar14;
      } while (pDVar4 != (DdNode *)0x0);
      table->nextFree = pDVar14;
    }
  }
  else {
    if (x_high == x) {
      uVar12 = x;
      do {
        uVar11 = table->subtableZ[(int)uVar12].next;
        bVar15 = uVar12 < uVar11;
        uVar12 = uVar11;
      } while (bVar15);
      do {
        uVar9 = uVar12;
        uVar12 = table->subtableZ[(int)uVar9].next;
      } while (uVar9 < uVar12);
      pDVar5 = (DdNode *)cuddZddSymmSifting_up(table,uVar11,x_low,initial_size);
      if (pDVar5 == (DdNode *)0x1) {
        return 0;
      }
      if (pDVar5 == (DdNode *)0x0) {
        uVar3 = uVar11;
        do {
          uVar12 = uVar3;
          uVar3 = table->subtableZ[(int)uVar12].next;
        } while (uVar12 < uVar3);
LAB_00928caa:
        if (uVar9 - uVar11 != uVar12 - uVar3) {
          initial_size = table->keysZ;
          goto LAB_00928e62;
        }
      }
      else {
        uVar12 = pDVar5->index;
        if (table->subtableZ[uVar12].next != uVar12) {
          uVar3 = table->subtableZ[(int)uVar12].next;
          goto LAB_00928caa;
        }
      }
      iVar2 = cuddZddSymmSiftingBackward(table,(Move *)pDVar5,initial_size);
      pDVar4 = (DdNode *)0x0;
      goto LAB_00928e79;
    }
    if (x_high - x < x - x_low) {
      do {
        uVar12 = x;
        x = table->subtableZ[(int)uVar12].next;
      } while (uVar12 < (uint)x);
      pDVar4 = (DdNode *)cuddZddSymmSifting_down(table,uVar12,x_high,initial_size);
      if (pDVar4 == (DdNode *)0x0) {
        pDVar7 = table->subtableZ;
        pDVar8 = &pDVar7[(int)uVar12].next;
      }
      else {
        if (pDVar4 == (DdNode *)0x1) {
          return 0;
        }
        pDVar8 = &pDVar4->ref;
        pDVar7 = table->subtableZ;
      }
      uVar11 = *pDVar8;
      uVar12 = uVar11;
      do {
        uVar9 = uVar12;
        uVar12 = pDVar7[(int)uVar9].next;
      } while (uVar9 < pDVar7[(int)uVar9].next);
      pDVar6 = (DdNode *)cuddZddSymmSifting_up(table,uVar11,x_low,initial_size);
      if (pDVar6 != (DdNode *)0x1) {
        pDVar5 = pDVar6;
        if (pDVar6 == (DdNode *)0x0) {
          uVar3 = uVar11;
          do {
            uVar12 = uVar3;
            uVar3 = table->subtableZ[(int)uVar12].next;
          } while (uVar12 < uVar3);
        }
        else {
          uVar12 = pDVar6->index;
          if (table->subtableZ[uVar12].next == uVar12) goto LAB_00928e74;
          uVar3 = table->subtableZ[(int)uVar12].next;
        }
        if (uVar9 - uVar11 == uVar12 - uVar3) goto LAB_00928e74;
        if (pDVar4 != (DdNode *)0x0) {
          pDVar6 = table->nextFree;
          do {
            pDVar14 = pDVar4;
            pDVar4 = (pDVar14->type).kids.T;
            pDVar14->ref = 0;
            pDVar14->next = pDVar6;
            pDVar6 = pDVar14;
          } while (pDVar4 != (DdNode *)0x0);
          table->nextFree = pDVar14;
        }
        initial_size = table->keysZ;
        x = x_high;
LAB_00928e62:
        pDVar6 = (DdNode *)cuddZddSymmSifting_down(table,uVar12,x,initial_size);
        pDVar4 = pDVar6;
        goto LAB_00928e74;
      }
      pDVar5 = (DdNode *)0x1;
      goto LAB_00928edb;
    }
    do {
      uVar12 = table->subtableZ[x].next;
      bVar15 = (uint)x < uVar12;
      x = uVar12;
    } while (bVar15);
    pDVar5 = (DdNode *)cuddZddSymmSifting_up(table,uVar12,x_low,initial_size);
    if (pDVar5 == (DdNode *)0x1) {
      return 0;
    }
    if (pDVar5 == (DdNode *)0x0) {
      do {
        x_00 = uVar12;
        lVar13 = (long)(int)x_00;
        uVar12 = table->subtableZ[lVar13].next;
      } while (x_00 < uVar12);
    }
    else {
      x_00 = pDVar5->index;
      lVar13 = (long)(int)x_00;
      uVar12 = table->subtableZ[lVar13].next;
    }
    pDVar6 = (DdNode *)cuddZddSymmSifting_down(table,x_00,x_high,initial_size);
    pDVar4 = pDVar6;
    if (pDVar6 == (DdNode *)0x0) {
      pDVar7 = table->subtableZ;
      uVar10 = (ulong)pDVar7[lVar13].next;
LAB_00928db4:
      iVar2 = (int)uVar10;
      do {
        uVar11 = (uint)uVar10;
        uVar10 = (ulong)pDVar7[(int)uVar11].next;
      } while (uVar11 < pDVar7[(int)uVar11].next);
      if (x_00 - uVar12 == uVar11 - iVar2) goto LAB_00928e74;
      if (pDVar5 != (DdNode *)0x0) {
        pDVar6 = table->nextFree;
        do {
          pDVar14 = pDVar5;
          pDVar5 = (pDVar14->type).kids.T;
          pDVar14->ref = 0;
          pDVar14->next = pDVar6;
          pDVar6 = pDVar14;
        } while (pDVar5 != (DdNode *)0x0);
        table->nextFree = pDVar14;
      }
      initial_size = table->keysZ;
      x = x_low;
      goto LAB_00928c7c;
    }
    if (pDVar6 != (DdNode *)0x1) {
      pDVar7 = table->subtableZ;
      uVar10 = (ulong)pDVar6->ref;
      if (pDVar7[uVar10].next == pDVar6->ref) goto LAB_00928e74;
      goto LAB_00928db4;
    }
  }
  iVar2 = 0;
  if (pDVar5 < (DdNode *)0x2) {
    return 0;
  }
  pDVar4 = table->nextFree;
  do {
    pDVar6 = pDVar5;
    pDVar5 = (pDVar6->type).kids.T;
    pDVar6->ref = 0;
    pDVar6->next = pDVar4;
    pDVar4 = pDVar6;
  } while (pDVar5 != (DdNode *)0x0);
LAB_00928f32:
  table->nextFree = pDVar6;
  return iVar2;
}

Assistant:

static int
cuddZddSymmSiftingAux(
  DdManager * table,
  int  x,
  int  x_low,
  int  x_high)
{
    Move *move;
    Move *move_up;      /* list of up move */
    Move *move_down;    /* list of down move */
    int  initial_size;
    int  result;
    int  i;
    int  topbot;        /* index to either top or bottom of symmetry group */
    int  init_group_size, final_group_size;

    initial_size = table->keysZ;

    move_down = NULL;
    move_up = NULL;

    /* Look for consecutive symmetries above x. */
    for (i = x; i > x_low; i--) {
        if (!cuddZddSymmCheck(table, i - 1, i))
            break;
        /* find top of i-1's symmetry */
        topbot = table->subtableZ[i - 1].next;
        table->subtableZ[i - 1].next = i;
        table->subtableZ[x].next = topbot;
        /* x is bottom of group so its symmetry is top of i-1's
           group */
        i = topbot + 1; /* add 1 for i--, new i is top of symm group */
    }
    /* Look for consecutive symmetries below x. */
    for (i = x; i < x_high; i++) {
        if (!cuddZddSymmCheck(table, i, i + 1))
            break;
        /* find bottom of i+1's symm group */
        topbot = i + 1;
        while ((unsigned) topbot < table->subtableZ[topbot].next)
            topbot = table->subtableZ[topbot].next;

        table->subtableZ[topbot].next = table->subtableZ[i].next;
        table->subtableZ[i].next = i + 1;
        i = topbot - 1; /* add 1 for i++,
                           new i is bottom of symm group */
    }

    /* Now x maybe in the middle of a symmetry group. */
    if (x == x_low) { /* Sift down */
        /* Find bottom of x's symm group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;

        i = table->subtableZ[x].next;
        init_group_size = x - i + 1;

        move_down = cuddZddSymmSifting_down(table, x, x_high,
            initial_size);
        /* after that point x --> x_high, unless early term */
        if (move_down == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_down == NULL ||
            table->subtableZ[move_down->y].next != move_down->y) {
            /* symmetry detected may have to make another complete
               pass */
            if (move_down != NULL)
                x = move_down->y;
            else
                x = table->subtableZ[x].next;
            i = x;
            while ((unsigned) i < table->subtableZ[i].next) {
                i = table->subtableZ[i].next;
            }
            final_group_size = i - x + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetry groups detected,
                   return to best position */
                result = cuddZddSymmSiftingBackward(table,
                    move_down, initial_size);
            }
            else {
                initial_size = table->keysZ;
                move_up = cuddZddSymmSifting_up(table, x, x_low,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_down,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }
    else if (x == x_high) { /* Sift up */
        /* Find top of x's symm group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;
        x = table->subtableZ[x].next;

        i = x;
        while ((unsigned) i < table->subtableZ[i].next) {
            i = table->subtableZ[i].next;
        }
        init_group_size = i - x + 1;

        move_up = cuddZddSymmSifting_up(table, x, x_low, initial_size);
        /* after that point x --> x_low, unless early term */
        if (move_up == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_up == NULL ||
            table->subtableZ[move_up->x].next != move_up->x) {
            /* symmetry detected may have to make another complete
                pass */
            if (move_up != NULL)
                x = move_up->x;
            else {
                while ((unsigned) x < table->subtableZ[x].next)
                    x = table->subtableZ[x].next;
            }
            i = table->subtableZ[x].next;
            final_group_size = x - i + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetry groups detected,
                   return to best position */
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
            else {
                initial_size = table->keysZ;
                move_down = cuddZddSymmSifting_down(table, x, x_high,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_down,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_up,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }
    else if ((x - x_low) > (x_high - x)) { /* must go down first:
                                                shorter */
        /* Find bottom of x's symm group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;

        move_down = cuddZddSymmSifting_down(table, x, x_high,
            initial_size);
        /* after that point x --> x_high, unless early term */
        if (move_down == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_down != NULL) {
            x = move_down->y;
        }
        else {
            x = table->subtableZ[x].next;
        }
        i = x;
        while ((unsigned) i < table->subtableZ[i].next) {
            i = table->subtableZ[i].next;
        }
        init_group_size = i - x + 1;

        move_up = cuddZddSymmSifting_up(table, x, x_low, initial_size);
        if (move_up == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_up == NULL ||
            table->subtableZ[move_up->x].next != move_up->x) {
            /* symmetry detected may have to make another complete
               pass */
            if (move_up != NULL) {
                x = move_up->x;
            }
            else {
                while ((unsigned) x < table->subtableZ[x].next)
                    x = table->subtableZ[x].next;
            }
            i = table->subtableZ[x].next;
            final_group_size = x - i + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetry groups detected,
                   return to best position */
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
            else {
                while (move_down != NULL) {
                    move = move_down->next;
                    cuddDeallocMove(table, move_down);
                    move_down = move;
                }
                initial_size = table->keysZ;
                move_down = cuddZddSymmSifting_down(table, x, x_high,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_down,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_up,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }
    else { /* moving up first:shorter */
        /* Find top of x's symmetry group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;
        x = table->subtableZ[x].next;

        move_up = cuddZddSymmSifting_up(table, x, x_low, initial_size);
        /* after that point x --> x_high, unless early term */
        if (move_up == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_up != NULL) {
            x = move_up->x;
        }
        else {
            while ((unsigned) x < table->subtableZ[x].next)
                x = table->subtableZ[x].next;
        }
        i = table->subtableZ[x].next;
        init_group_size = x - i + 1;

        move_down = cuddZddSymmSifting_down(table, x, x_high,
            initial_size);
        if (move_down == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_down == NULL ||
            table->subtableZ[move_down->y].next != move_down->y) {
            /* symmetry detected may have to make another complete
               pass */
            if (move_down != NULL) {
                x = move_down->y;
            }
            else {
                x = table->subtableZ[x].next;
            }
            i = x;
            while ((unsigned) i < table->subtableZ[i].next) {
                i = table->subtableZ[i].next;
            }
            final_group_size = i - x + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetries detected,
                   go back to best position */
                result = cuddZddSymmSiftingBackward(table, move_down,
                    initial_size);
            }
            else {
                while (move_up != NULL) {
                    move = move_up->next;
                    cuddDeallocMove(table, move_up);
                    move_up = move;
                }
                initial_size = table->keysZ;
                move_up = cuddZddSymmSifting_up(table, x, x_low,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_down,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }

    while (move_down != NULL) {
        move = move_down->next;
        cuddDeallocMove(table, move_down);
        move_down = move;
    }
    while (move_up != NULL) {
        move = move_up->next;
        cuddDeallocMove(table, move_up);
        move_up = move;
    }

    return(1);

cuddZddSymmSiftingAuxOutOfMem:
    if (move_down != ZDD_MV_OOM) {
        while (move_down != NULL) {
            move = move_down->next;
            cuddDeallocMove(table, move_down);
            move_down = move;
        }
    }
    if (move_up != ZDD_MV_OOM) {
        while (move_up != NULL) {
            move = move_up->next;
            cuddDeallocMove(table, move_up);
            move_up = move;
        }
    }

    return(0);

}